

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# classmetadata.cpp
# Opt level: O0

void __thiscall stackjit::ClassMetadata::setParentClass(ClassMetadata *this,ClassType *parentClass)

{
  runtime_error *this_00;
  ClassType *parentClass_local;
  ClassMetadata *this_local;
  
  if (this->mParentClass != (ClassType *)0x0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"The parent class has already been set.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  this->mParentClass = parentClass;
  return;
}

Assistant:

void ClassMetadata::setParentClass(const ClassType* parentClass) {
		if (mParentClass != nullptr) {
			throw std::runtime_error("The parent class has already been set.");
		}

		this->mParentClass = parentClass;
	}